

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O1

type __thiscall
robin_hood::detail::
Table<true,80ul,std::__cxx11::string,std::unique_ptr<Rml::Context,Rml::Releaser<Rml::Context>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
::
doCreateByKey<std::__cxx11::string_const&,std::unique_ptr<Rml::Context,Rml::Releaser<Rml::Context>>>
          (Table<true,80ul,std::__cxx11::string,std::unique_ptr<Rml::Context,Rml::Releaser<Rml::Context>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key)

{
  byte *pbVar1;
  char *pcVar2;
  byte bVar3;
  int iVar4;
  pointer pcVar5;
  Context *__n;
  long *plVar6;
  bool bVar7;
  long *plVar8;
  int iVar9;
  type in_RAX;
  size_t sVar10;
  long lVar11;
  uint uVar12;
  ulong insertion_idx;
  long lVar13;
  string *this_00;
  long *local_60 [2];
  long local_50 [2];
  long *local_40;
  type local_38;
  
  do {
    local_38 = in_RAX;
    sVar10 = hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
             ::operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                           *)this,key);
    uVar12 = ((uint)sVar10 & 0x1f) >> ((byte)this[0x2c] & 0x3f);
    iVar4 = *(int *)(this + 0x28);
    insertion_idx = sVar10 >> 5 & *(ulong *)(this + 0x18);
    lVar13 = *(long *)(this + 8);
    bVar3 = *(byte *)(lVar13 + insertion_idx);
    while (uVar12 = uVar12 + iVar4, uVar12 < bVar3) {
      pbVar1 = (byte *)(lVar13 + 1 + insertion_idx);
      insertion_idx = insertion_idx + 1;
      bVar3 = *pbVar1;
    }
    if (uVar12 == *(byte *)(lVar13 + insertion_idx)) {
      pcVar5 = (key->_M_dataplus)._M_p;
      __n = (Context *)key->_M_string_length;
      in_RAX = (type)(*(long *)this + insertion_idx * 0x28 + 0x20);
      do {
        if (__n == in_RAX[-3]._M_t.super___uniq_ptr_impl<Rml::Context,_Rml::Releaser<Rml::Context>_>
                   ._M_t.super__Tuple_impl<0UL,_Rml::Context_*,_Rml::Releaser<Rml::Context>_>.
                   super__Head_base<0UL,_Rml::Context_*,_false>._M_head_impl) {
          bVar7 = true;
          if (__n == (Context *)0x0) goto LAB_001f0ea8;
          iVar9 = bcmp(pcVar5,in_RAX[-4]._M_t.
                              super___uniq_ptr_impl<Rml::Context,_Rml::Releaser<Rml::Context>_>._M_t
                              .super__Tuple_impl<0UL,_Rml::Context_*,_Rml::Releaser<Rml::Context>_>.
                              super__Head_base<0UL,_Rml::Context_*,_false>._M_head_impl,(size_t)__n)
          ;
          if (iVar9 == 0) goto LAB_001f0ea6;
        }
        uVar12 = uVar12 + iVar4;
        pbVar1 = (byte *)(lVar13 + 1 + insertion_idx);
        insertion_idx = insertion_idx + 1;
        in_RAX = in_RAX + 5;
      } while (uVar12 == *pbVar1);
    }
    if (*(ulong *)(this + 0x10) < *(ulong *)(this + 0x20)) {
      if (0xff < iVar4 + uVar12) {
        *(undefined8 *)(this + 0x20) = 0;
      }
      lVar11 = 1;
      do {
        lVar11 = lVar11 + -1;
        pcVar2 = (char *)(lVar13 + insertion_idx);
        lVar13 = lVar13 + 1;
      } while (*pcVar2 != '\0');
      this_00 = (string *)(insertion_idx * 0x28 + *(long *)this);
      if (lVar11 == 0) {
        *(string **)this_00 = this_00 + 0x10;
        pcVar5 = (key->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>(this_00,pcVar5,pcVar5 + key->_M_string_length);
        *(undefined8 *)(this_00 + 0x20) = 0;
      }
      else {
        Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::Context,_Rml::Releaser<Rml::Context>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::shiftUp((Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::Context,_Rml::Releaser<Rml::Context>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)this,insertion_idx - lVar11,insertion_idx);
        local_60[0] = local_50;
        pcVar5 = (key->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_60,pcVar5,pcVar5 + key->_M_string_length);
        local_40 = (long *)0x0;
        std::__cxx11::string::operator=(this_00,(string *)local_60);
        plVar8 = local_40;
        local_40 = (long *)0x0;
        plVar6 = *(long **)(this_00 + 0x20);
        *(long **)(this_00 + 0x20) = plVar8;
        if (plVar6 != (long *)0x0) {
          (**(code **)(*plVar6 + 0x10))();
        }
        if (local_40 != (long *)0x0) {
          (**(code **)(*local_40 + 0x10))();
        }
        local_40 = (long *)0x0;
        if (local_60[0] != local_50) {
          operator_delete(local_60[0],local_50[0] + 1);
        }
      }
      *(char *)(*(long *)(this + 8) + insertion_idx) = (char)uVar12;
      *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
      in_RAX = (type)(*(long *)this + insertion_idx * 0x28 + 0x20);
LAB_001f0ea6:
      bVar7 = true;
    }
    else {
      Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::Context,_Rml::Releaser<Rml::Context>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::increase_size((Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::Context,_Rml::Releaser<Rml::Context>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)this);
      bVar7 = false;
      in_RAX = local_38;
    }
LAB_001f0ea8:
    if (bVar7) {
      return in_RAX;
    }
  } while( true );
}

Assistant:

typename std::enable_if<!std::is_void<Q>::value, Q&>::type doCreateByKey(Arg&& key) {
        while (true) {
            size_t idx{};
            InfoType info{};
            keyToIdx(key, &idx, &info);
            nextWhileLess(&info, &idx);

            // while we potentially have a match. Can't do a do-while here because when mInfo is
            // 0 we don't want to skip forward
            while (info == mInfo[idx]) {
                if (WKeyEqual::operator()(key, mKeyVals[idx].getFirst())) {
                    // key already exists, do not insert.
                    return mKeyVals[idx].getSecond();
                }
                next(&info, &idx);
            }

            // unlikely that this evaluates to true
            if (ROBIN_HOOD_UNLIKELY(mNumElements >= mMaxNumElementsAllowed)) {
                increase_size();
                continue;
            }

            // key not found, so we are now exactly where we want to insert it.
            auto const insertion_idx = idx;
            auto const insertion_info = info;
            if (ROBIN_HOOD_UNLIKELY(insertion_info + mInfoInc > 0xFF)) {
                mMaxNumElementsAllowed = 0;
            }

            // find an empty spot
            while (0 != mInfo[idx]) {
                next(&info, &idx);
            }

            auto& l = mKeyVals[insertion_idx];
            if (idx == insertion_idx) {
                // put at empty spot. This forwards all arguments into the node where the object
                // is constructed exactly where it is needed.
                ::new (static_cast<void*>(&l))
                    Node(*this, std::piecewise_construct,
                         std::forward_as_tuple(std::forward<Arg>(key)), std::forward_as_tuple());
            } else {
                shiftUp(idx, insertion_idx);
                l = Node(*this, std::piecewise_construct,
                         std::forward_as_tuple(std::forward<Arg>(key)), std::forward_as_tuple());
            }

            // mKeyVals[idx].getFirst() = std::move(key);
            mInfo[insertion_idx] = static_cast<uint8_t>(insertion_info);

            ++mNumElements;
            return mKeyVals[insertion_idx].getSecond();
        }
    }